

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpheaders.c
# Opt level: O2

HTTP_HEADERS_RESULT
HTTPHeaders_GetHeader(HTTP_HEADERS_HANDLE handle,size_t index,char **destination)

{
  MAP_RESULT MVar1;
  LOGGER_LOG p_Var2;
  size_t __n;
  size_t sVar3;
  char *pcVar4;
  int iVar5;
  HTTP_HEADERS_RESULT HVar6;
  char *pcVar7;
  char *__size;
  char *pcVar8;
  undefined8 uVar9;
  size_t headerCount;
  char **values;
  char **keys;
  
  if (handle == (HTTP_HEADERS_HANDLE)0x0 || destination == (char **)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return HTTP_HEADERS_INVALID_ARG;
    }
    pcVar7 = "invalid arg (NULL), result= %s%s (%d)";
    iVar5 = 0xff;
LAB_0010cf9d:
    HVar6 = HTTP_HEADERS_INVALID_ARG;
    uVar9 = 2;
    pcVar8 = (char *)0x2;
    pcVar4 = HTTP_HEADERS_RESULTStringStorage[2];
  }
  else {
    MVar1 = Map_GetInternals(handle->headers,&keys,&values,&headerCount);
    if (MVar1 == MAP_OK) {
      if (index < headerCount) {
        __n = strlen(keys[index]);
        sVar3 = strlen(values[index]);
        pcVar4 = (char *)0xffffffffffffffff;
        pcVar8 = (char *)(__n + 2);
        if (0xfffffffffffffffd < __n) {
          pcVar8 = pcVar4;
        }
        pcVar7 = pcVar8 + sVar3;
        if (CARRY8((ulong)pcVar8,sVar3)) {
          pcVar7 = pcVar4;
        }
        __size = pcVar7 + 1;
        if (pcVar7 + 1 == (char *)0x0) {
          __size = pcVar4;
        }
        if (__size != (char *)0xffffffffffffffff) {
          pcVar4 = (char *)malloc((size_t)__size);
          *destination = pcVar4;
          if (pcVar4 != (char *)0x0) {
            memcpy(pcVar4,keys[index],__n);
            (pcVar4 + __n)[0] = ':';
            (pcVar4 + __n)[1] = ' ';
            memcpy(pcVar4 + __n + 2,values[index],sVar3 + 1);
            return HTTP_HEADERS_OK;
          }
        }
        *destination = (char *)0x0;
        p_Var2 = xlogging_get_log_function();
        HVar6 = HTTP_HEADERS_ERROR;
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return HTTP_HEADERS_ERROR;
        }
        pcVar7 = "unable to malloc, size=%zu, result= %s%s (%d)";
        iVar5 = 0x124;
        uVar9 = 5;
        pcVar4 = "";
        pcVar8 = HTTP_HEADERS_RESULTStringStorage[5];
        goto LAB_0010d0cb;
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return HTTP_HEADERS_INVALID_ARG;
      }
      pcVar7 = "index out of bounds, result= %s%s (%d)";
      iVar5 = 0x114;
      goto LAB_0010cf9d;
    }
    p_Var2 = xlogging_get_log_function();
    uVar9 = 5;
    HVar6 = HTTP_HEADERS_ERROR;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return HTTP_HEADERS_ERROR;
    }
    pcVar7 = "Map_GetInternals failed, result= %s%s (%d)";
    iVar5 = 0x10c;
    pcVar8 = (char *)0x5;
    pcVar4 = HTTP_HEADERS_RESULTStringStorage[5];
  }
  __size = "";
LAB_0010d0cb:
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/src/httpheaders.c"
            ,"HTTPHeaders_GetHeader",iVar5,1,pcVar7,__size,pcVar4,pcVar8,uVar9);
  return HVar6;
}

Assistant:

HTTP_HEADERS_RESULT HTTPHeaders_GetHeader(HTTP_HEADERS_HANDLE handle, size_t index, char** destination)
{
    HTTP_HEADERS_RESULT result = HTTP_HEADERS_OK;

    /*Codes_SRS_HTTP_HEADERS_99_028:[ The function shall return NULL if the handle is invalid.]*/
    /*Codes_SRS_HTTP_HEADERS_99_032:[ The function shall return HTTP_HEADERS_INVALID_ARG if the destination  is NULL]*/
    if (
        (handle == NULL) ||
        (destination == NULL)
        )
    {
        result = HTTP_HEADERS_INVALID_ARG;
        LogError("invalid arg (NULL), result= %" PRI_MU_ENUM "", MU_ENUM_VALUE(HTTP_HEADERS_RESULT, result));
    }
    /*Codes_SRS_HTTP_HEADERS_99_029:[ The function shall return HTTP_HEADERS_INVALID_ARG if index is not valid (for example, out of range) for the currently stored headers.]*/
    else
    {
        HTTP_HEADERS_HANDLE_DATA* handleData = (HTTP_HEADERS_HANDLE_DATA*)handle;
        const char*const* keys;
        const char*const* values;
        size_t headerCount;
        if (Map_GetInternals(handleData->headers, &keys, &values, &headerCount) != MAP_OK)
        {
            /*Codes_SRS_HTTP_HEADERS_99_034:[ The function shall return HTTP_HEADERS_ERROR when an internal error occurs]*/
            result = HTTP_HEADERS_ERROR;
            LogError("Map_GetInternals failed, result= %" PRI_MU_ENUM "", MU_ENUM_VALUE(HTTP_HEADERS_RESULT, result));
        }
        else
        {
            /*Codes_SRS_HTTP_HEADERS_99_029:[ The function shall return HTTP_HEADERS_INVALID_ARG if index is not valid (for example, out of range) for the currently stored headers.]*/
            if (index >= headerCount)
            {
                result = HTTP_HEADERS_INVALID_ARG;
                LogError("index out of bounds, result= %" PRI_MU_ENUM "", MU_ENUM_VALUE(HTTP_HEADERS_RESULT, result));
            }
            else
            {
                size_t keyLen = strlen(keys[index]);
                size_t valueLen = strlen(values[index]);
                size_t malloc_size = safe_add_size_t(keyLen, /*COLON_AND_SPACE_LENGTH*/ 2);
                malloc_size = safe_add_size_t(malloc_size, valueLen);
                malloc_size = safe_add_size_t(malloc_size, /*EOL*/ 1);
                malloc_size = safe_multiply_size_t(malloc_size, sizeof(char));
                if (malloc_size == SIZE_MAX ||
                    (*destination = (char*)malloc(malloc_size)) == NULL)
                {
                    /*Codes_SRS_HTTP_HEADERS_99_034:[ The function shall return HTTP_HEADERS_ERROR when an internal error occurs]*/
                    result = HTTP_HEADERS_ERROR;
                    *destination = NULL;
                    LogError("unable to malloc, size=%zu, result= %" PRI_MU_ENUM "", malloc_size, MU_ENUM_VALUE(HTTP_HEADERS_RESULT, result));
                }
                else
                {
                    /*Codes_SRS_HTTP_HEADERS_99_016:[ The function shall store the name:value pair in such a way that when later retrieved by a call to GetHeader it will return a string that shall strcmp equal to the name+": "+value.]*/
                    /*Codes_SRS_HTTP_HEADERS_99_027:[ Calling this API shall produce the string value+": "+pair) for the index header in the *destination parameter.]*/
                    char* runDestination = (*destination);
                    (void)memcpy(runDestination, keys[index], keyLen);
                    runDestination += keyLen;
                    (*runDestination++) = ':';
                    (*runDestination++) = ' ';
                    (void)memcpy(runDestination, values[index], valueLen + /*EOL*/ 1);
                    /*Codes_SRS_HTTP_HEADERS_99_035:[ The function shall return HTTP_HEADERS_OK when the function executed without error.]*/
                    result = HTTP_HEADERS_OK;
                }
            }
        }
    }

    return result;
}